

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::OneofDescriptor::GetLocationPath
          (OneofDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int local_18 [2];
  
  Descriptor::GetLocationPath(this->containing_type_,output);
  local_18[1] = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18 + 1);
  local_18[0] = (int)(((long)this - (long)this->containing_type_->oneof_decls_) / 0x38);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18);
  return;
}

Assistant:

void OneofDescriptor::GetLocationPath(std::vector<int>* output) const {
  containing_type()->GetLocationPath(output);
  output->push_back(DescriptorProto::kOneofDeclFieldNumber);
  output->push_back(index());
}